

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string<int>(string *__return_storage_ptr__,int *value)

{
  int *in_RDX;
  string local_38;
  int *local_18;
  int *value_local;
  
  local_18 = value;
  value_local = (int *)__return_storage_ptr__;
  string_maker<int>::to_string_abi_cxx11_(&local_38,(string_maker<int> *)value,in_RDX);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}